

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_record.cpp
# Opt level: O2

void __thiscall cubeb_record_Test::TestBody(cubeb_record_Test *this)

{
  cubeb_stream *stream_00;
  cubeb *context;
  int iVar1;
  Message *pMVar2;
  FILE *in_RCX;
  anon_enum_32 *actual;
  char *pcVar3;
  cubeb_stream *stream;
  user_state_record stream_state;
  int r;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertionResult gtest_ar_1;
  cubeb *ctx;
  AssertionResult gtest_ar;
  AssertHelper local_28;
  
  iVar1 = cubeb_set_log_callback(CUBEB_LOG_DISABLED,(cubeb_log_callback)0x0);
  if (iVar1 != 0) {
    in_RCX = _stderr;
    fwrite("Set log callback failed\n",0x18,1,_stderr);
  }
  stream_state.invalid_audio_value.super___atomic_base<int>._M_i =
       (atomic<int>)(__atomic_base<int>)0x0;
  r = common_init(&ctx,"Cubeb record example");
  gtest_ar_1.success_ = false;
  gtest_ar_1._1_3_ = 0;
  testing::internal::EqHelper<false>::Compare<int,__0>
            (&gtest_ar.success_,(char *)&r,(int *)&gtest_ar_1,&in_RCX->_flags);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    pMVar2 = testing::Message::operator<<
                       ((Message *)&gtest_ar_1,(char (*) [33])"Error initializing cubeb library");
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stream,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_record.cpp"
               ,0x52,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stream,pMVar2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stream);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    context = ctx;
    iVar1 = has_available_input_device(ctx);
    if (iVar1 != 0) {
      gtest_ar.success_ = true;
      gtest_ar._1_7_ = 0xbb80000000;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      actual = (anon_enum_32 *)0x0;
      r = cubeb_stream_init(ctx,&stream,"Cubeb record (mono)",(cubeb_devid)0x0,
                            (cubeb_stream_params *)&gtest_ar,(cubeb_devid)0x0,
                            (cubeb_stream_params *)0x0,0x1000,data_cb_record,state_cb_record,
                            &stream_state);
      local_68.ptr_._0_4_ = 0;
      testing::internal::EqHelper<false>::Compare<int,__0>
                (&gtest_ar_1.success_,(char *)&r,(int *)&local_68,actual);
      if (gtest_ar_1.success_ == false) {
        testing::Message::Message((Message *)&local_68);
        pMVar2 = testing::Message::operator<<
                           ((Message *)&local_68,(char (*) [32])"Error initializing cubeb stream");
        if (gtest_ar_1.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_28,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_record.cpp"
                   ,0x65,pcVar3);
        testing::internal::AssertHelper::operator=(&local_28,pMVar2);
        testing::internal::AssertHelper::~AssertHelper(&local_28);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_68);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_1.message_);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_1.message_);
        stream_00 = stream;
        cubeb_stream_start(stream);
        delay(500);
        cubeb_stream_stop(stream);
        fwrite("Check is disabled in Linux\n",0x1b,1,_stderr);
        if (stream_00 != (cubeb_stream *)0x0) {
          cubeb_stream_destroy(stream_00);
        }
      }
    }
    if (context != (cubeb *)0x0) {
      cubeb_destroy(context);
    }
  }
  return;
}

Assistant:

TEST(cubeb, record)
{
  if (cubeb_set_log_callback(CUBEB_LOG_DISABLED, nullptr /*print_log*/) != CUBEB_OK) {
    fprintf(stderr, "Set log callback failed\n");
  }
  cubeb *ctx;
  cubeb_stream *stream;
  cubeb_stream_params params;
  int r;
  user_state_record stream_state;

  r = common_init(&ctx, "Cubeb record example");
  ASSERT_EQ(r, CUBEB_OK) << "Error initializing cubeb library";

  std::unique_ptr<cubeb, decltype(&cubeb_destroy)>
    cleanup_cubeb_at_exit(ctx, cubeb_destroy);

  /* This test needs an available input device, skip it if this host does not
   * have one. */
  if (!has_available_input_device(ctx)) {
    return;
  }

  params.format = STREAM_FORMAT;
  params.rate = SAMPLE_FREQUENCY;
  params.channels = 1;
  params.layout = CUBEB_LAYOUT_UNDEFINED;
  params.prefs = CUBEB_STREAM_PREF_NONE;

  r = cubeb_stream_init(ctx, &stream, "Cubeb record (mono)", NULL, &params, NULL, nullptr,
                        4096, data_cb_record, state_cb_record, &stream_state);
  ASSERT_EQ(r, CUBEB_OK) << "Error initializing cubeb stream";

  std::unique_ptr<cubeb_stream, decltype(&cubeb_stream_destroy)>
    cleanup_stream_at_exit(stream, cubeb_stream_destroy);

  cubeb_stream_start(stream);
  delay(500);
  cubeb_stream_stop(stream);

#ifdef __linux__
  // user callback does not arrive in Linux, silence the error
  fprintf(stderr, "Check is disabled in Linux\n");
#else
  ASSERT_FALSE(stream_state.invalid_audio_value.load());
#endif
}